

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O1

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  _Elt_pointer ppVVar1;
  pointer pcVar2;
  size_type sVar3;
  cmScanDepInfo *this;
  LookupMethod LVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  UInt UVar8;
  ArrayIndex AVar9;
  int iVar10;
  Value *pVVar11;
  Value *pVVar12;
  Value *pVVar13;
  cmSourceReqInfo *provide;
  pointer pcVar14;
  undefined1 *puVar15;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Alloc_hider _Var18;
  size_type __rlen;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_19;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_20;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_21;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_22;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_23;
  const_iterator cVar19;
  string wd;
  string extra_output;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  string lookup_method_str;
  Reader reader;
  Value ppio;
  ifstream ppf;
  undefined1 local_498 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_470;
  undefined1 local_468 [48];
  String local_438;
  char local_418;
  string local_410;
  cmScanDepInfo *local_3f0;
  SelfType local_3e8;
  undefined1 local_3d8 [32];
  string local_3b8;
  undefined1 local_398 [32];
  undefined2 local_378;
  LookupMethod local_374;
  _Alloc_hider local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [3];
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  ValueIteratorBase local_2a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_298;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_290;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_288;
  SelfType local_280;
  Value local_270;
  SelfType local_248;
  istream local_238 [520];
  
  local_3f0 = info;
  Json::Value::Value(&local_270,nullValue);
  std::ifstream::ifstream(local_238,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_3d8);
  bVar5 = Json::Reader::parse((Reader *)local_3d8,local_238,&local_270,false);
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_p != &local_2e0) {
      operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_p != local_328) {
      operator_delete(local_338._M_p,local_328[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               (local_398 + 0x10));
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3d8);
LAB_00544bc3:
    pVVar11 = Json::Value::operator[](&local_270,"version");
    UVar8 = Json::Value::asUInt(pVVar11);
    if (UVar8 < 2) {
      pVVar11 = Json::Value::operator[](&local_270,"rules");
      bVar5 = Json::Value::isArray(pVVar11);
      if (bVar5) {
        AVar9 = Json::Value::size(pVVar11);
        if (AVar9 != 1) {
          local_3d8._24_8_ = (arg_pp->_M_dataplus)._M_p;
          local_3d8._16_8_ = arg_pp->_M_string_length;
          local_3d8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x26;
          local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
          local_3b8._M_dataplus._M_p = (pointer)0x19;
          local_3b8._M_string_length = 0x7a9443;
          views_23._M_len = 3;
          views_23._M_array = (iterator)local_3d8;
          cmCatViews_abi_cxx11_((string *)local_498,views_23);
          cmSystemTools::Error((string *)local_498);
          local_438.field_2._M_allocated_capacity = local_498._16_8_;
          local_438._M_dataplus._M_p = (pointer)local_498._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498 + 0x10)) goto LAB_00544c89;
          goto LAB_00544c91;
        }
        cVar19 = Json::Value::begin(pVVar11);
        local_2a8.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
        local_2a8.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
        cVar19 = Json::Value::end(pVVar11);
        local_248.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
        local_248.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
        local_298 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    &local_3f0->ExtraOutputs;
        local_288 = &local_3f0->Provides;
        local_290 = &local_3f0->Requires;
        while (bVar5 = Json::ValueIteratorBase::isEqual(&local_2a8,&local_248), !bVar5) {
          pVVar11 = Json::ValueIteratorBase::deref(&local_2a8);
          local_418 = '\0';
          pVVar12 = Json::Value::operator[](pVVar11,"work-directory");
          bVar5 = Json::Value::isString(pVVar12);
          if (!bVar5) {
            bVar5 = Json::Value::isNull(pVVar12);
            if (bVar5) goto LAB_00544ea7;
            local_3d8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_498._8_8_ = (arg_pp->_M_dataplus)._M_p;
            local_498._0_8_ = arg_pp->_M_string_length;
            cmStrCat<char[33]>((string *)local_468,(cmAlphaNum *)local_3d8,(cmAlphaNum *)local_498,
                               (char (*) [33])": work-directory is not a string");
            cmSystemTools::Error((string *)local_468);
LAB_0054664b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_468 + 0x10)) {
              operator_delete((void *)local_468._0_8_,CONCAT71(local_468._17_7_,local_468[0x10]) + 1
                             );
            }
LAB_00546667:
            if ((local_418 != '\x01') ||
               (local_418 = '\0',
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_438._M_dataplus._M_p == &local_438.field_2)) goto LAB_00544c91;
            goto LAB_00544c89;
          }
          local_498._0_8_ = local_498 + 0x10;
          local_498._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_498._16_8_ = local_498._16_8_ & 0xffffffffffffff00;
          bVar5 = ParseFilename(pVVar12,(string *)local_498);
          if (bVar5) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_438,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_498);
          }
          else {
            local_3d8._24_8_ = (arg_pp->_M_dataplus)._M_p;
            local_3d8._16_8_ = arg_pp->_M_string_length;
            local_3d8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_3b8._M_dataplus._M_p = (pointer)0xe;
            local_3b8._M_string_length = 0x7a946c;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_3d8;
            cmCatViews_abi_cxx11_((string *)local_468,views_01);
            cmSystemTools::Error((string *)local_468);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_468 + 0x10)) {
              operator_delete((void *)local_468._0_8_,CONCAT71(local_468._17_7_,local_468[0x10]) + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498 + 0x10)) {
            operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
          }
          if (!bVar5) goto LAB_00546667;
LAB_00544ea7:
          bVar5 = Json::Value::isMember(pVVar11,"primary-output");
          if (bVar5) {
            pVVar12 = Json::Value::operator[](pVVar11,"primary-output");
            bVar5 = ParseFilename(pVVar12,&local_3f0->PrimaryOutput);
            if (bVar5) {
              if (((local_418 == '\x01') &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_438._M_string_length !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) &&
                 (bVar6 = cmsys::SystemTools::FileIsFullPath(&local_3f0->PrimaryOutput),
                 this = local_3f0, !bVar6)) {
                local_498._0_8_ = &DAT_00000001;
                local_498._8_8_ = local_498 + 0x10;
                local_498[0x10] = 0x2f;
                local_3d8._0_8_ = local_438._M_string_length;
                local_3d8._8_8_ = local_438._M_dataplus._M_p;
                local_3d8._16_8_ = &DAT_00000001;
                local_3b8._M_string_length = (size_type)(local_3f0->PrimaryOutput)._M_dataplus._M_p;
                local_3b8._M_dataplus._M_p = (pointer)(local_3f0->PrimaryOutput)._M_string_length;
                views_02._M_len = 3;
                views_02._M_array = (iterator)local_3d8;
                local_3d8._24_8_ = local_498._8_8_;
                cmCatViews_abi_cxx11_((string *)local_468,views_02);
                std::__cxx11::string::operator=((string *)this,(string *)local_468);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_468 + 0x10)) {
                  puVar15 = (undefined1 *)CONCAT71(local_468._17_7_,local_468[0x10]);
                  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_468._0_8_;
                  goto LAB_0054503a;
                }
              }
            }
            else {
              local_3d8._24_8_ = (arg_pp->_M_dataplus)._M_p;
              local_3d8._16_8_ = arg_pp->_M_string_length;
              local_3d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_3b8._M_dataplus._M_p = (pointer)0x12;
              local_3b8._M_string_length = 0x7a94ab;
              views_03._M_len = 3;
              views_03._M_array = (iterator)local_3d8;
              cmCatViews_abi_cxx11_((string *)local_498,views_03);
              cmSystemTools::Error((string *)local_498);
              puVar15 = (undefined1 *)local_498._16_8_;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_498._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_498 + 0x10)) {
LAB_0054503a:
                operator_delete(paVar17,(ulong)(puVar15 + 1));
              }
            }
            if (!bVar5) goto LAB_00546667;
          }
          bVar5 = Json::Value::isMember(pVVar11,"outputs");
          if (bVar5) {
            pVVar12 = Json::Value::operator[](pVVar11,"outputs");
            bVar5 = Json::Value::isArray(pVVar12);
            if (bVar5) {
              cVar19 = Json::Value::begin(pVVar12);
              local_2c8._0_8_ = cVar19.super_ValueIteratorBase.current_._M_node;
              local_2c8[8] = cVar19.super_ValueIteratorBase.isNull_;
              cVar19 = Json::Value::end(pVVar12);
              local_3e8.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
              local_3e8.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
              while (bVar5 = Json::ValueIteratorBase::isEqual
                                       ((ValueIteratorBase *)local_2c8,&local_3e8), !bVar5) {
                pVVar12 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_2c8);
                local_468._0_8_ = local_468 + 0x10;
                local_468._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_468[0x10] = '\0';
                bVar5 = ParseFilename(pVVar12,(string *)local_468);
                if (bVar5) {
                  if (((local_418 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_438._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar6 = cmsys::SystemTools::FileIsFullPath((string *)local_468), !bVar6)) {
                    local_498._0_8_ = &DAT_00000001;
                    local_498._8_8_ = local_498 + 0x10;
                    local_498[0x10] = 0x2f;
                    local_3d8._0_8_ = local_438._M_string_length;
                    local_3d8._8_8_ = local_438._M_dataplus._M_p;
                    local_3d8._16_8_ = &DAT_00000001;
                    local_3b8._M_dataplus._M_p = (pointer)local_468._8_8_;
                    local_3b8._M_string_length = local_468._0_8_;
                    views_04._M_len = 3;
                    views_04._M_array = (iterator)local_3d8;
                    local_3d8._24_8_ = local_498._8_8_;
                    cmCatViews_abi_cxx11_(&local_410,views_04);
                    std::__cxx11::string::operator=((string *)local_468,(string *)&local_410);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      operator_delete(local_410._M_dataplus._M_p,
                                      local_410.field_2._M_allocated_capacity + 1);
                    }
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            (local_298,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_468);
                }
                else {
                  local_3d8._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_3d8._16_8_ = arg_pp->_M_string_length;
                  local_3d8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_3b8._M_dataplus._M_p = (pointer)0x12;
                  local_3b8._M_string_length = 0x7a94ab;
                  views_05._M_len = 3;
                  views_05._M_array = (iterator)local_3d8;
                  cmCatViews_abi_cxx11_((string *)local_498,views_05);
                  cmSystemTools::Error((string *)local_498);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_498._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_498 + 0x10)) {
                    operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_468 + 0x10)) {
                  operator_delete((void *)local_468._0_8_,
                                  CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
                }
                if (!bVar5) goto LAB_00546667;
                Json::ValueIteratorBase::increment((ValueIteratorBase *)local_2c8);
              }
            }
          }
          bVar5 = Json::Value::isMember(pVVar11,"provides");
          if (bVar5) {
            pVVar12 = Json::Value::operator[](pVVar11,"provides");
            bVar5 = Json::Value::isArray(pVVar12);
            if (!bVar5) {
              local_3d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_498._8_8_ = (arg_pp->_M_dataplus)._M_p;
              local_498._0_8_ = arg_pp->_M_string_length;
              cmStrCat<char[27]>((string *)local_468,(cmAlphaNum *)local_3d8,(cmAlphaNum *)local_498
                                 ,(char (*) [27])": provides is not an array");
              cmSystemTools::Error((string *)local_468);
              goto LAB_0054664b;
            }
            cVar19 = Json::Value::begin(pVVar12);
            local_2c8._0_8_ = cVar19.super_ValueIteratorBase.current_._M_node;
            local_2c8[8] = cVar19.super_ValueIteratorBase.isNull_;
            cVar19 = Json::Value::end(pVVar12);
            local_3e8.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
            local_3e8.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
            while (bVar5 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)local_2c8,&local_3e8), !bVar5) {
              pVVar12 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_2c8);
              local_3d8._0_8_ = local_3d8 + 0x10;
              local_3d8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3d8._16_8_ = local_3d8._16_8_ & 0xffffffffffffff00;
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              local_3b8._M_string_length = 0;
              local_3b8.field_2._M_allocated_capacity =
                   local_3b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_398._0_8_ = local_398 + 0x10;
              local_398._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_398[0x10] = '\0';
              local_378 = 0x100;
              local_374 = ByName;
              pVVar13 = Json::Value::operator[](pVVar12,"logical-name");
              bVar6 = ParseFilename(pVVar13,(string *)local_3d8);
              if (!bVar6) {
                local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_498._16_8_ = arg_pp->_M_string_length;
                local_498._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7a946c;
                views_12._M_len = 3;
                views_12._M_array = (iterator)local_498;
                cmCatViews_abi_cxx11_((string *)local_468,views_12);
                cmSystemTools::Error((string *)local_468);
LAB_005459f0:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_468 + 0x10)) {
                  operator_delete((void *)local_468._0_8_,
                                  CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
                }
LAB_00545a0c:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_398 + 0x10)) {
                  operator_delete((void *)local_398._0_8_,
                                  CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                  operator_delete(local_3b8._M_dataplus._M_p,
                                  (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8 + 0x10)) {
                  operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
                }
                if (!bVar5) goto LAB_00546667;
                break;
              }
              bVar6 = Json::Value::isMember(pVVar12,"compiled-module-path");
              if (bVar6) {
                pVVar13 = Json::Value::operator[](pVVar12,"compiled-module-path");
                bVar6 = ParseFilename(pVVar13,(string *)local_398);
                if (bVar6) {
                  if (((local_418 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_438._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar7 = cmsys::SystemTools::FileIsFullPath((string *)local_398), !bVar7)) {
                    local_468._0_8_ = &DAT_00000001;
                    local_498._24_8_ = local_468 + 0x10;
                    local_468[0x10] = '/';
                    local_498._0_8_ = local_438._M_string_length;
                    local_498._8_8_ = local_438._M_dataplus._M_p;
                    local_498._16_8_ = &DAT_00000001;
                    local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_398._8_8_;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_398._0_8_;
                    views_06._M_len = 3;
                    views_06._M_array = (iterator)local_498;
                    local_468._8_8_ = local_498._24_8_;
                    cmCatViews_abi_cxx11_(&local_410,views_06);
                    std::__cxx11::string::operator=((string *)local_398,(string *)&local_410);
                    uVar16 = local_410.field_2._M_allocated_capacity;
                    _Var18._M_p = local_410._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) goto LAB_00545566;
                  }
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a94ab;
                  views_07._M_len = 3;
                  views_07._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_07);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    uVar16 = CONCAT71(local_468._17_7_,local_468[0x10]);
                    _Var18._M_p = (pointer)local_468._0_8_;
LAB_00545566:
                    operator_delete(_Var18._M_p,uVar16 + 1);
                  }
                }
                if (bVar6) goto LAB_00545577;
                goto LAB_00545a0c;
              }
LAB_00545577:
              bVar6 = Json::Value::isMember(pVVar12,"unique-on-source-path");
              if (bVar6) {
                pVVar13 = Json::Value::operator[](pVVar12,"unique-on-source-path");
                bVar6 = Json::Value::isBool(pVVar13);
                if (bVar6) {
                  bVar7 = Json::Value::asBool(pVVar13);
                  local_378 = CONCAT11(local_378._1_1_,bVar7);
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a9522;
                  views_08._M_len = 3;
                  views_08._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_08);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    operator_delete((void *)local_468._0_8_,
                                    CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
                  }
                }
                if (!bVar6) goto LAB_00545a0c;
              }
              else {
                local_378 = local_378 & 0xff00;
              }
              bVar6 = Json::Value::isMember(pVVar12,"source-path");
              if (bVar6) {
                pVVar13 = Json::Value::operator[](pVVar12,"source-path");
                bVar6 = ParseFilename(pVVar13,&local_3b8);
                if (bVar6) {
                  if (((local_418 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_438._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) && (bVar7 = cmsys::SystemTools::FileIsFullPath(&local_3b8), !bVar7))
                  {
                    local_468._0_8_ = &DAT_00000001;
                    local_498._24_8_ = local_468 + 0x10;
                    local_468[0x10] = '/';
                    local_498._0_8_ = local_438._M_string_length;
                    local_498._8_8_ = local_438._M_dataplus._M_p;
                    local_498._16_8_ = &DAT_00000001;
                    local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_string_length;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_dataplus._M_p;
                    views_09._M_len = 3;
                    views_09._M_array = (iterator)local_498;
                    local_468._8_8_ = local_498._24_8_;
                    cmCatViews_abi_cxx11_(&local_410,views_09);
                    std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_410);
                    uVar16 = local_410.field_2._M_allocated_capacity;
                    _Var18._M_p = local_410._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) goto LAB_005457cb;
                  }
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a94ab;
                  views_10._M_len = 3;
                  views_10._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_10);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    uVar16 = CONCAT71(local_468._17_7_,local_468[0x10]);
                    _Var18._M_p = (pointer)local_468._0_8_;
LAB_005457cb:
                    operator_delete(_Var18._M_p,uVar16 + 1);
                  }
                }
                if (!bVar6) goto LAB_00545a0c;
              }
              else if (local_378._0_1_ == true) {
                local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_498._16_8_ = arg_pp->_M_string_length;
                local_498._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7a954b;
                views_13._M_len = 3;
                views_13._M_array = (iterator)local_498;
                cmCatViews_abi_cxx11_((string *)local_468,views_13);
                cmSystemTools::Error((string *)local_468);
                goto LAB_005459f0;
              }
              bVar6 = Json::Value::isMember(pVVar12,"is-interface");
              if (bVar6) {
                pVVar12 = Json::Value::operator[](pVVar12,"is-interface");
                bVar6 = Json::Value::isBool(pVVar12);
                if (bVar6) {
                  bVar7 = Json::Value::asBool(pVVar12);
                  local_378 = CONCAT11(bVar7,local_378._0_1_);
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a9571;
                  views_11._M_len = 3;
                  views_11._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_11);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    operator_delete((void *)local_468._0_8_,
                                    CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
                  }
                }
                if (!bVar6) goto LAB_00545a0c;
              }
              else {
                local_378 = CONCAT11(1,local_378._0_1_);
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_288,(value_type *)local_3d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_398 + 0x10)) {
                operator_delete((void *)local_398._0_8_,
                                CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                operator_delete(local_3b8._M_dataplus._M_p,
                                (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3d8 + 0x10)) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_2c8);
            }
          }
          bVar5 = Json::Value::isMember(pVVar11,"requires");
          if (bVar5) {
            pVVar12 = Json::Value::operator[](pVVar11,"requires");
            bVar5 = Json::Value::isArray(pVVar12);
            if (!bVar5) {
              local_3d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_498._8_8_ = (arg_pp->_M_dataplus)._M_p;
              local_498._0_8_ = arg_pp->_M_string_length;
              cmStrCat<char[27]>((string *)local_468,(cmAlphaNum *)local_3d8,(cmAlphaNum *)local_498
                                 ,(char (*) [27])": requires is not an array");
              cmSystemTools::Error((string *)local_468);
              goto LAB_0054664b;
            }
            cVar19 = Json::Value::begin(pVVar12);
            local_3e8.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
            local_3e8.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
            cVar19 = Json::Value::end(pVVar12);
            local_280.current_ = cVar19.super_ValueIteratorBase.current_._M_node;
            local_280.isNull_ = cVar19.super_ValueIteratorBase.isNull_;
            while (bVar5 = Json::ValueIteratorBase::isEqual(&local_3e8,&local_280), !bVar5) {
              pVVar12 = Json::ValueIteratorBase::deref(&local_3e8);
              local_3d8._0_8_ = local_3d8 + 0x10;
              local_3d8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3d8._16_8_ = local_3d8._16_8_ & 0xffffffffffffff00;
              local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              local_3b8._M_string_length = 0;
              local_3b8.field_2._M_allocated_capacity =
                   local_3b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_398._0_8_ = local_398 + 0x10;
              local_398._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_398[0x10] = '\0';
              local_378 = 0x100;
              local_374 = ByName;
              pVVar13 = Json::Value::operator[](pVVar12,"logical-name");
              bVar6 = ParseFilename(pVVar13,(string *)local_3d8);
              if (!bVar6) {
                local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_498._16_8_ = arg_pp->_M_string_length;
                local_498._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7a946c;
                views_19._M_len = 3;
                views_19._M_array = (iterator)local_498;
                cmCatViews_abi_cxx11_((string *)local_468,views_19);
                cmSystemTools::Error((string *)local_468);
LAB_005462eb:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_468 + 0x10)) {
                  uVar16 = CONCAT71(local_468._17_7_,local_468[0x10]);
                  _Var18._M_p = (pointer)local_468._0_8_;
LAB_005462ff:
                  operator_delete(_Var18._M_p,uVar16 + 1);
                }
LAB_00546307:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_398 + 0x10)) {
                  operator_delete((void *)local_398._0_8_,
                                  CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                  operator_delete(local_3b8._M_dataplus._M_p,
                                  (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8 + 0x10)) {
                  operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
                }
                if (!bVar5) goto LAB_00546667;
                break;
              }
              bVar6 = Json::Value::isMember(pVVar12,"compiled-module-path");
              if (bVar6) {
                pVVar13 = Json::Value::operator[](pVVar12,"compiled-module-path");
                bVar6 = ParseFilename(pVVar13,(string *)local_398);
                if (bVar6) {
                  if (((local_418 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_438._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar7 = cmsys::SystemTools::FileIsFullPath((string *)local_398), !bVar7)) {
                    local_468._0_8_ = &DAT_00000001;
                    local_498._24_8_ = local_468 + 0x10;
                    local_468[0x10] = '/';
                    local_498._0_8_ = local_438._M_string_length;
                    local_498._8_8_ = local_438._M_dataplus._M_p;
                    local_498._16_8_ = &DAT_00000001;
                    local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_398._8_8_;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_398._0_8_;
                    views_14._M_len = 3;
                    views_14._M_array = (iterator)local_498;
                    local_468._8_8_ = local_498._24_8_;
                    cmCatViews_abi_cxx11_(&local_410,views_14);
                    std::__cxx11::string::operator=((string *)local_398,(string *)&local_410);
                    uVar16 = local_410.field_2._M_allocated_capacity;
                    _Var18._M_p = local_410._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) goto LAB_00545d2b;
                  }
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a94ab;
                  views_15._M_len = 3;
                  views_15._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_15);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    uVar16 = CONCAT71(local_468._17_7_,local_468[0x10]);
                    _Var18._M_p = (pointer)local_468._0_8_;
LAB_00545d2b:
                    operator_delete(_Var18._M_p,uVar16 + 1);
                  }
                }
                if (bVar6) goto LAB_00545d3c;
                goto LAB_00546307;
              }
LAB_00545d3c:
              bVar6 = Json::Value::isMember(pVVar12,"unique-on-source-path");
              if (bVar6) {
                pVVar13 = Json::Value::operator[](pVVar12,"unique-on-source-path");
                bVar6 = Json::Value::isBool(pVVar13);
                if (bVar6) {
                  bVar7 = Json::Value::asBool(pVVar13);
                  local_378 = CONCAT11(local_378._1_1_,bVar7);
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a9522;
                  views_16._M_len = 3;
                  views_16._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_16);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    operator_delete((void *)local_468._0_8_,
                                    CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
                  }
                }
                if (!bVar6) goto LAB_00546307;
              }
              else {
                local_378 = local_378 & 0xff00;
              }
              bVar6 = Json::Value::isMember(pVVar12,"source-path");
              if (bVar6) {
                pVVar13 = Json::Value::operator[](pVVar12,"source-path");
                bVar6 = ParseFilename(pVVar13,&local_3b8);
                if (bVar6) {
                  if (((local_418 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_438._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) && (bVar7 = cmsys::SystemTools::FileIsFullPath(&local_3b8), !bVar7))
                  {
                    local_468._0_8_ = &DAT_00000001;
                    local_498._24_8_ = local_468 + 0x10;
                    local_468[0x10] = '/';
                    local_498._0_8_ = local_438._M_string_length;
                    local_498._8_8_ = local_438._M_dataplus._M_p;
                    local_498._16_8_ = &DAT_00000001;
                    local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_string_length;
                    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_dataplus._M_p;
                    views_17._M_len = 3;
                    views_17._M_array = (iterator)local_498;
                    local_468._8_8_ = local_498._24_8_;
                    cmCatViews_abi_cxx11_(&local_410,views_17);
                    std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_410);
                    uVar16 = local_410.field_2._M_allocated_capacity;
                    _Var18._M_p = local_410._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) goto LAB_00545f90;
                  }
                }
                else {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a94ab;
                  views_18._M_len = 3;
                  views_18._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_18);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    uVar16 = CONCAT71(local_468._17_7_,local_468[0x10]);
                    _Var18._M_p = (pointer)local_468._0_8_;
LAB_00545f90:
                    operator_delete(_Var18._M_p,uVar16 + 1);
                  }
                }
                if (!bVar6) goto LAB_00546307;
              }
              else if (local_378._0_1_ == true) {
                local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_498._16_8_ = arg_pp->_M_string_length;
                local_498._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7a954b;
                views_20._M_len = 3;
                views_20._M_array = (iterator)local_498;
                cmCatViews_abi_cxx11_((string *)local_468,views_20);
                cmSystemTools::Error((string *)local_468);
                goto LAB_005462eb;
              }
              bVar6 = Json::Value::isMember(pVVar12,"lookup-method");
              if (bVar6) {
                pVVar12 = Json::Value::operator[](pVVar12,"lookup-method");
                bVar6 = Json::Value::isString(pVVar12);
                if (!bVar6) {
                  local_498._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._16_8_ = arg_pp->_M_string_length;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x7a95ac;
                  views_21._M_len = 3;
                  views_21._M_array = (iterator)local_498;
                  cmCatViews_abi_cxx11_((string *)local_468,views_21);
                  cmSystemTools::Error((string *)local_468);
                  goto LAB_005462eb;
                }
                Json::Value::asString_abi_cxx11_(&local_410,pVVar12);
                sVar3 = local_410._M_string_length;
                _Var18._M_p = local_410._M_dataplus._M_p;
                if ((local_410._M_string_length == 7) &&
                   (iVar10 = bcmp(local_410._M_dataplus._M_p,"by-name",7), iVar10 == 0)) {
                  LVar4 = ByName;
                }
                else {
                  if (sVar3 != 0xd) {
LAB_0054619c:
                    local_498._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x26;
                    local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                    local_468._8_8_ = (arg_pp->_M_dataplus)._M_p;
                    local_468._0_8_ = arg_pp->_M_string_length;
                    cmStrCat<char[33],std::__cxx11::string>
                              ((string *)local_2c8,(cmAlphaNum *)local_498,(cmAlphaNum *)local_468,
                               (char (*) [33])": lookup-method is not a valid: ",&local_410);
                    cmSystemTools::Error((string *)local_2c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._0_8_ != &local_2b8) {
                      operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
                    }
                    uVar16 = local_410.field_2._M_allocated_capacity;
                    _Var18._M_p = local_410._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) goto LAB_005462ff;
                    goto LAB_00546307;
                  }
                  iVar10 = bcmp(_Var18._M_p,"include-angle",0xd);
                  if (iVar10 == 0) {
                    LVar4 = IncludeAngle;
                  }
                  else {
                    iVar10 = bcmp(_Var18._M_p,"include-quote",0xd);
                    LVar4 = IncludeQuote;
                    if (iVar10 != 0) goto LAB_0054619c;
                  }
                }
                local_374 = LVar4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var18._M_p != &local_410.field_2) {
                  operator_delete(_Var18._M_p,local_410.field_2._M_allocated_capacity + 1);
                }
              }
              else if (local_378._0_1_ == true) {
                local_374 = ByName;
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_290,(value_type *)local_3d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_398 + 0x10)) {
                operator_delete((void *)local_398._0_8_,
                                CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                operator_delete(local_3b8._M_dataplus._M_p,
                                (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3d8 + 0x10)) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
              }
              Json::ValueIteratorBase::increment(&local_3e8);
            }
          }
          bVar5 = Json::Value::isMember(pVVar11,"is-interface");
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: acknowledging an VS 17.3 toolchain bug; accepting until a new release which fixes it is available"
                       ,0x6a);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
            std::ostream::put('`');
            std::ostream::flush();
            pVVar11 = Json::Value::operator[](pVVar11,"is-interface");
            bVar5 = Json::Value::isBool(pVVar11);
            if (bVar5) {
              bVar6 = Json::Value::asBool(pVVar11);
              pcVar2 = (local_3f0->Provides).
                       super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              for (pcVar14 = (local_3f0->Provides).
                             super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
                             _M_impl.super__Vector_impl_data._M_start; pcVar14 != pcVar2;
                  pcVar14 = pcVar14 + 1) {
                pcVar14->IsInterface = bVar6;
              }
            }
            else {
              local_3d8._24_8_ = (arg_pp->_M_dataplus)._M_p;
              local_3d8._16_8_ = arg_pp->_M_string_length;
              local_3d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_3b8._M_dataplus._M_p = (pointer)0x1f;
              local_3b8._M_string_length = 0x7a9571;
              views_22._M_len = 3;
              views_22._M_array = (iterator)local_3d8;
              cmCatViews_abi_cxx11_((string *)local_498,views_22);
              cmSystemTools::Error((string *)local_498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_498 + 0x10)) {
                operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
              }
            }
            if (!bVar5) goto LAB_00546667;
          }
          if ((local_418 == '\x01') &&
             (local_418 = '\0',
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_438._M_dataplus._M_p != &local_438.field_2)) {
            operator_delete(local_438._M_dataplus._M_p,
                            (ulong)(local_438.field_2._M_allocated_capacity + 1));
          }
          Json::ValueIteratorBase::increment(&local_2a8);
        }
      }
      bVar5 = true;
      goto LAB_00544c93;
    }
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(arg_pp->_M_dataplus)._M_p;
    ppVVar1 = (_Elt_pointer)arg_pp->_M_string_length;
    Json::Value::asString_abi_cxx11_((String *)local_468,pVVar11);
    local_3d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x26;
    local_3d8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
    local_3b8._M_dataplus._M_p = (pointer)0xa;
    local_3b8._M_string_length = 0x7a9432;
    local_3b8.field_2._M_allocated_capacity = local_468._8_8_;
    local_3b8.field_2._8_8_ = local_468._0_8_;
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_3d8;
    local_3d8._16_8_ = ppVVar1;
    local_3d8._24_8_ = paVar17;
    cmCatViews_abi_cxx11_((string *)local_498,views_00);
    cmSystemTools::Error((string *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) {
      local_438.field_2._M_allocated_capacity =
           (size_type)(undefined1 *)CONCAT71(local_468._17_7_,local_468[0x10]);
      local_438._M_dataplus._M_p = (pointer)local_468._0_8_;
LAB_00544c89:
      operator_delete(local_438._M_dataplus._M_p,
                      (ulong)(local_438.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(arg_pp->_M_dataplus)._M_p;
    puVar15 = (undefined1 *)arg_pp->_M_string_length;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_438,(Reader *)local_3d8);
    local_498._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x26;
    local_498._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
    local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_string_length;
    local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)local_498;
    local_498._16_8_ = puVar15;
    local_498._24_8_ = paVar17;
    cmCatViews_abi_cxx11_((string *)local_468,views);
    cmSystemTools::Error((string *)local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,
                      (ulong)(local_438.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_p != &local_2e0) {
      operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_p != local_328) {
      operator_delete(local_338._M_p,local_328[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               (local_398 + 0x10));
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3d8);
    if (bVar5) goto LAB_00544bc3;
  }
LAB_00544c91:
  bVar5 = false;
LAB_00544c93:
  std::ifstream::~ifstream(local_238);
  Json::Value::~Value(&local_270);
  return bVar5;
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }

      // MSVC 17.3 toolchain bug. Remove when 17.4 is available.
      if (rule.isMember("is-interface")) {
        std::cerr
          << "warning: acknowledging an VS 17.3 toolchain bug; accepting "
             "until a new release which fixes it is available"
          << std::endl;

        Json::Value const& is_interface_json = rule["is-interface"];
        if (!is_interface_json.isBool()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": is-interface is not a boolean"));
          return false;
        }
        bool is_interface = is_interface_json.asBool();

        for (auto& provide : info->Provides) {
          provide.IsInterface = is_interface;
        }
      }
    }
  }

  return true;
}